

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O1

int GetAllValuesPololu(POLOLU *pPololu,int *selectedchannels,int *ais)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uchar sendbuf [512];
  uchar recvbuf [512];
  undefined1 local_438 [512];
  timespec local_238 [32];
  
  lVar6 = 0;
  memset(local_438,0,0x200);
  iVar7 = 0;
  iVar1 = 0;
  do {
    if (selectedchannels[lVar6] != 0) {
      local_438[iVar1] = 0xaa;
      local_438[(long)iVar1 + 1] = (char)pPololu->DeviceNumber;
      local_438[(long)iVar1 + 2] = 0x10;
      local_438[(long)iVar1 + 3] = (char)lVar6;
      iVar7 = iVar7 + 1;
      iVar1 = iVar1 + 4;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x18);
  if (iVar7 != 0) {
    uVar3 = iVar7 * 4;
    iVar1 = (pPololu->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      if (0 < iVar7) {
        iVar1 = (pPololu->RS232Port).s;
        uVar5 = 0;
        do {
          sVar2 = send(iVar1,local_438 + uVar5,(long)(int)(uVar3 - (int)uVar5),0);
          if ((int)sVar2 < 1) {
            return 1;
          }
          uVar4 = (int)uVar5 + (int)sVar2;
          uVar5 = (ulong)uVar4;
        } while ((int)uVar4 < (int)uVar3);
      }
    }
    else {
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = *(int *)&(pPololu->RS232Port).hDev;
      uVar5 = 0;
      do {
        sVar2 = write(iVar1,local_438 + uVar5,(ulong)(uVar3 - (int)uVar5));
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar4 = (int)uVar5 + (int)sVar2;
        uVar5 = (ulong)uVar4;
      } while (uVar4 < uVar3);
    }
    if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_438,(long)(int)uVar3,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    local_238[0].tv_sec = 0;
    local_238[0].tv_nsec = 10000000;
    nanosleep(local_238,(timespec *)0x0);
    memset(local_238,0,0x200);
    uVar3 = iVar7 * 2;
    iVar1 = (pPololu->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      if (0 < iVar7) {
        iVar1 = (pPololu->RS232Port).s;
        uVar5 = 0;
        do {
          sVar2 = recv(iVar1,(void *)((long)&local_238[0].tv_sec + uVar5),
                       (long)(int)(uVar3 - (int)uVar5),0);
          if ((int)sVar2 < 1) {
            return 1;
          }
          uVar4 = (int)uVar5 + (int)sVar2;
          uVar5 = (ulong)uVar4;
        } while ((int)uVar4 < (int)uVar3);
      }
    }
    else {
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = *(int *)&(pPololu->RS232Port).hDev;
      uVar5 = 0;
      do {
        sVar2 = read(iVar1,(void *)((long)&local_238[0].tv_sec + uVar5),(ulong)(uVar3 - (int)uVar5))
        ;
        if ((int)sVar2 < 1) {
          return 1;
        }
        uVar4 = (int)uVar5 + (int)sVar2;
        uVar5 = (ulong)uVar4;
      } while (uVar4 < uVar3);
    }
    if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,(long)(int)uVar3,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    ais[0x14] = 0;
    ais[0x15] = 0;
    ais[0x16] = 0;
    ais[0x17] = 0;
    ais[0x10] = 0;
    ais[0x11] = 0;
    ais[0x12] = 0;
    ais[0x13] = 0;
    ais[0xc] = 0;
    ais[0xd] = 0;
    ais[0xe] = 0;
    ais[0xf] = 0;
    ais[8] = 0;
    ais[9] = 0;
    ais[10] = 0;
    ais[0xb] = 0;
    ais[4] = 0;
    ais[5] = 0;
    ais[6] = 0;
    ais[7] = 0;
    ais[0] = 0;
    ais[1] = 0;
    ais[2] = 0;
    ais[3] = 0;
    lVar6 = 0;
    iVar1 = 0;
    do {
      if (selectedchannels[lVar6] != 0) {
        uVar3 = (uint)*(ushort *)((long)&local_238[0].tv_sec + (long)iVar1);
        ais[lVar6] = uVar3;
        pPololu->LastAIs[lVar6] = uVar3;
        iVar1 = iVar1 + 2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x18);
  }
  return 0;
}

Assistant:

inline int GetAllValuesPololu(POLOLU* pPololu, int* selectedchannels, int* ais)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	unsigned char recvbuf[MAX_NB_BYTES_POLOLU];
	int sendbuflen = 0;
	int recvbuflen = 0;
	int channel = 0;
	int index = 0, nbselectedchannels = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	nbselectedchannels = 0;
	index = 0;

	for (channel = 0; channel < NB_CHANNELS_AI_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		sendbuf[index] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[index+1] = (unsigned char)pPololu->DeviceNumber;
		sendbuf[index+2] = (unsigned char)(GET_POSITION_COMMAND_POLOLU & 0x7F);
		sendbuf[index+3] = (unsigned char)channel;	
		nbselectedchannels++;
		index += 4;
	}

	if (nbselectedchannels == 0) return EXIT_SUCCESS;

	sendbuflen = 4*nbselectedchannels;

	//printf("%s\n", sendbuf);

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	mSleep(10); // Added because sometimes there was a timeout on the read() 
	// (even though the data were available if read just after the timeout...)...

	// Prepare the buffer that should receive data from device.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 2*nbselectedchannels;

	if (ReadAllRS232Port(&pPololu->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}
	
	// Display and analyze received data.
	//printf("Received : \"%s\"\n", recvbuf);

	memset(ais, 0, NB_CHANNELS_AI_POLOLU*sizeof(int));
	index = 0;

	for (channel = 0; channel < NB_CHANNELS_AI_POLOLU; channel++)
	{
		if (!selectedchannels[channel]) continue;

		ais[channel] = recvbuf[index] + 256*recvbuf[index+1];

		// Update last known value.
		pPololu->LastAIs[channel] = ais[channel];
				
		index += 2;
	}

	return EXIT_SUCCESS;
}